

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O0

void __thiscall
cmLocalUnixMakefileGenerator3::AppendEcho
          (cmLocalUnixMakefileGenerator3 *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *commands,string *text,EchoColor color,EchoProgress *progress)

{
  bool bVar1;
  ulong uVar2;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  undefined1 local_a8 [8];
  string cmd;
  char *c;
  string line;
  string local_50 [8];
  string color_name;
  EchoProgress *progress_local;
  EchoColor color_local;
  string *text_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *commands_local;
  cmLocalUnixMakefileGenerator3 *this_local;
  
  color_name.field_2._8_8_ = progress;
  std::__cxx11::string::string(local_50);
  bVar1 = cmGlobalGenerator::GetToolSupportsColor
                    ((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator);
  if ((bVar1) && ((this->ColorMakefile & 1U) != 0)) {
    switch(color) {
    case EchoNormal:
      break;
    case EchoDepend:
      std::__cxx11::string::operator=(local_50,"--magenta --bold ");
      break;
    case EchoBuild:
      std::__cxx11::string::operator=(local_50,"--green ");
      break;
    case EchoLink:
      std::__cxx11::string::operator=(local_50,"--green --bold ");
      break;
    case EchoGenerate:
      std::__cxx11::string::operator=(local_50,"--blue --bold ");
      break;
    case EchoGlobal:
      std::__cxx11::string::operator=(local_50,"--cyan ");
    }
  }
  std::__cxx11::string::string((string *)&c);
  std::__cxx11::string::reserve((ulong)&c);
  cmd.field_2._8_8_ = std::__cxx11::string::c_str();
  do {
    if ((*(char *)cmd.field_2._8_8_ == '\n') || (*(char *)cmd.field_2._8_8_ == '\0')) {
      if ((*(char *)cmd.field_2._8_8_ != '\0') ||
         (uVar2 = std::__cxx11::string::empty(), (uVar2 & 1) == 0)) {
        std::__cxx11::string::string((string *)local_a8);
        uVar2 = std::__cxx11::string::empty();
        if (((uVar2 & 1) == 0) || (color_name.field_2._8_8_ != 0)) {
          std::__cxx11::string::operator=
                    ((string *)local_a8,"@$(CMAKE_COMMAND) -E cmake_echo_color --switch=$(COLOR) ");
          std::__cxx11::string::operator+=((string *)local_a8,local_50);
          if (color_name.field_2._8_8_ != 0) {
            std::__cxx11::string::operator+=((string *)local_a8,"--progress-dir=");
            cmsys::SystemTools::CollapseFullPath(&local_108,(string *)color_name.field_2._8_8_);
            cmOutputConverter::ConvertToOutputFormat
                      (&local_e8,
                       &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                        super_cmOutputConverter,&local_108,SHELL);
            std::__cxx11::string::operator+=((string *)local_a8,(string *)&local_e8);
            std::__cxx11::string::~string((string *)&local_e8);
            std::__cxx11::string::~string((string *)&local_108);
            std::__cxx11::string::operator+=((string *)local_a8," ");
            std::__cxx11::string::operator+=((string *)local_a8,"--progress-num=");
            std::__cxx11::string::operator+=
                      ((string *)local_a8,(string *)(color_name.field_2._8_8_ + 0x20));
            std::__cxx11::string::operator+=((string *)local_a8," ");
          }
          cmOutputConverter::EscapeForShell
                    (&local_128,
                     &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                      super_cmOutputConverter,(string *)&c,false,false,false);
          std::__cxx11::string::operator+=((string *)local_a8,(string *)&local_128);
          std::__cxx11::string::~string((string *)&local_128);
        }
        else {
          std::__cxx11::string::operator=((string *)local_a8,"@echo ");
          cmOutputConverter::EscapeForShell
                    (&local_c8,
                     &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                      super_cmOutputConverter,(string *)&c,false,true,false);
          std::__cxx11::string::operator+=((string *)local_a8,(string *)&local_c8);
          std::__cxx11::string::~string((string *)&local_c8);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(commands,(value_type *)local_a8);
        std::__cxx11::string::~string((string *)local_a8);
      }
      std::__cxx11::string::operator=((string *)&c,"");
      color_name.field_2._8_8_ = 0;
      if (*(char *)cmd.field_2._8_8_ == '\0') {
        std::__cxx11::string::~string((string *)&c);
        std::__cxx11::string::~string(local_50);
        return;
      }
    }
    else if (*(char *)cmd.field_2._8_8_ != '\r') {
      std::__cxx11::string::operator+=((string *)&c,*(char *)cmd.field_2._8_8_);
    }
    cmd.field_2._8_8_ = cmd.field_2._8_8_ + 1;
  } while( true );
}

Assistant:

void cmLocalUnixMakefileGenerator3::AppendEcho(
  std::vector<std::string>& commands, std::string const& text, EchoColor color,
  EchoProgress const* progress)
{
  // Choose the color for the text.
  std::string color_name;
  if (this->GlobalGenerator->GetToolSupportsColor() && this->ColorMakefile) {
    // See cmake::ExecuteEchoColor in cmake.cxx for these options.
    // This color set is readable on both black and white backgrounds.
    switch (color) {
      case EchoNormal:
        break;
      case EchoDepend:
        color_name = "--magenta --bold ";
        break;
      case EchoBuild:
        color_name = "--green ";
        break;
      case EchoLink:
        color_name = "--green --bold ";
        break;
      case EchoGenerate:
        color_name = "--blue --bold ";
        break;
      case EchoGlobal:
        color_name = "--cyan ";
        break;
    }
  }

  // Echo one line at a time.
  std::string line;
  line.reserve(200);
  for (const char* c = text.c_str();; ++c) {
    if (*c == '\n' || *c == '\0') {
      // Avoid writing a blank last line on end-of-string.
      if (*c != '\0' || !line.empty()) {
        // Add a command to echo this line.
        std::string cmd;
        if (color_name.empty() && !progress) {
          // Use the native echo command.
          cmd = "@echo ";
          cmd += this->EscapeForShell(line, false, true);
        } else {
          // Use cmake to echo the text in color.
          cmd = "@$(CMAKE_COMMAND) -E cmake_echo_color --switch=$(COLOR) ";
          cmd += color_name;
          if (progress) {
            cmd += "--progress-dir=";
            cmd += this->ConvertToOutputFormat(
              cmSystemTools::CollapseFullPath(progress->Dir),
              cmOutputConverter::SHELL);
            cmd += " ";
            cmd += "--progress-num=";
            cmd += progress->Arg;
            cmd += " ";
          }
          cmd += this->EscapeForShell(line);
        }
        commands.push_back(cmd);
      }

      // Reset the line to emtpy.
      line = "";

      // Progress appears only on first line.
      progress = CM_NULLPTR;

      // Terminate on end-of-string.
      if (*c == '\0') {
        return;
      }
    } else if (*c != '\r') {
      // Append this character to the current line.
      line += *c;
    }
  }
}